

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

Process * asl::Process::execute
                    (Process *__return_storage_ptr__,String *command,Array<asl::String> *args)

{
  bool bVar1;
  int iVar2;
  Process *pPVar3;
  char buffer [8000];
  char acStack_1f68 [8000];
  
  Process(__return_storage_ptr__);
  run(__return_storage_ptr__,command,args);
  while (pPVar3 = __return_storage_ptr__, bVar1 = running(__return_storage_ptr__), bVar1) {
    sleep((uint)pPVar3);
    iVar2 = outputAvailable(__return_storage_ptr__);
    if (0 < iVar2) {
      iVar2 = readOutput(__return_storage_ptr__,acStack_1f68,8000);
      String::append(&__return_storage_ptr__->_output,acStack_1f68,iVar2);
    }
    iVar2 = errorsAvailable(__return_storage_ptr__);
    if (0 < iVar2) {
      iVar2 = readErrors(__return_storage_ptr__,acStack_1f68,8000);
      String::append(&__return_storage_ptr__->_errors,acStack_1f68,iVar2);
    }
  }
  while (iVar2 = readOutput(__return_storage_ptr__,acStack_1f68,8000), 0 < iVar2) {
    String::append(&__return_storage_ptr__->_output,acStack_1f68,iVar2);
  }
  while (iVar2 = readErrors(__return_storage_ptr__,acStack_1f68,8000), 0 < iVar2) {
    String::append(&__return_storage_ptr__->_errors,acStack_1f68,iVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Process Process::execute(const String& command, const Array<String>& args)
{
	Process p;
	p.run(command, args);
	int n, i = 0;
	char buffer[8000];
	while (p.running())
	{
		sleep((i++)%16 == 0 ? 0.001 : 0);
		if (p.outputAvailable() > 0)
		{
			n = p.readOutput(buffer, sizeof(buffer));
			p._output.append(buffer, n);
		}
		if (p.errorsAvailable() > 0)
		{
			n = p.readErrors(buffer, sizeof(buffer));
			p._errors.append(buffer, n);
		}
	}
	while (n = p.readOutput(buffer, sizeof(buffer)), n > 0)
		p._output.append(buffer, n);
	while (n = p.readErrors(buffer, sizeof(buffer)), n > 0)
		p._errors.append(buffer, n);
	p._exitstat = p.exitStatus();
	return p;
}